

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

Stats * Enhedron::Test::Impl::Impl_Suite::Register::run
                  (Stats *__return_storage_ptr__,PathList *pathList,
                  Out<Enhedron::Test::Impl::Impl_Results::Results> results)

{
  pointer puVar1;
  Context *pCVar2;
  Register *pRVar3;
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  *context;
  pointer puVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  ContextResultsRecorder resultsRecorder;
  long local_88;
  long lStack_80;
  long local_78;
  long lStack_70;
  long local_68;
  undefined **local_58;
  Results *local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  __return_storage_ptr__->checks_ = 0;
  __return_storage_ptr__->failedTests_ = 0;
  __return_storage_ptr__->fixtures_ = 0;
  __return_storage_ptr__->tests_ = 0;
  __return_storage_ptr__->failedChecks_ = 0;
  local_58 = &PTR_notifyPassing_00179148;
  local_48 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  local_50 = results.value;
  pRVar3 = instance();
  uVar6 = 0;
  uVar7 = 0;
  puVar1 = (pRVar3->contextList).
           super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar5 = 0;
  uVar8 = 0;
  uVar9 = 0;
  for (puVar4 = (pRVar3->contextList).
                super__Vector_base<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pCVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
             ._M_t.
             super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
             .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl
    ;
    (*pCVar2->_vptr_Context[3])(&local_88,pCVar2,pathList,&local_58,0);
    uVar6 = uVar6 + local_88;
    uVar7 = uVar7 + lStack_80;
    uVar5 = uVar5 + local_68;
    uVar8 = uVar8 + local_78;
    uVar9 = uVar9 + lStack_70;
    __return_storage_ptr__->fixtures_ = uVar6;
    __return_storage_ptr__->tests_ = uVar7;
    __return_storage_ptr__->checks_ = uVar8;
    __return_storage_ptr__->failedTests_ = uVar9;
    __return_storage_ptr__->failedChecks_ = uVar5;
  }
  (*(results.value)->_vptr_Results[2])(results.value,__return_storage_ptr__);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static Stats run(const PathList& pathList, Out<Results> results) {
            Stats stats;

            ContextResultsRecorder resultsRecorder(results);

            for (const auto& context : instance().contextList) {
                stats += context->run(pathList, out(resultsRecorder), 0);
            }

            results->finish(stats);
            return stats;
        }